

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall llvm::detail::IEEEFloat::initFromF80LongDoubleAPInt(IEEEFloat *this,APInt *api)

{
  byte bVar1;
  uint64_t uVar2;
  ulong uVar3;
  fltSemantics *pfVar4;
  Significand *pSVar5;
  uint uVar6;
  byte bVar7;
  bool bVar8;
  
  if (api->BitWidth != 0x50) {
    __assert_fail("api.getBitWidth()==80",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xbe1,"void llvm::detail::IEEEFloat::initFromF80LongDoubleAPInt(const APInt &)");
  }
  uVar2 = *(api->U).pVal;
  uVar3 = (api->U).pVal[1];
  initialize(this,(fltSemantics *)semX87DoubleExtended);
  pfVar4 = this->semantics;
  if ((pfVar4->precision & 0xffffffc0) != 0x40) {
    __assert_fail("partCount()==2",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                  ,0xbe9,"void llvm::detail::IEEEFloat::initFromF80LongDoubleAPInt(const APInt &)");
  }
  uVar6 = (uint)uVar3 & 0x7fff;
  bVar1 = this->field_0x12;
  bVar7 = (byte)((uint)uVar3 >> 0xc) & 8;
  if ((uVar3 & 0x7fff) == 0 && uVar2 == 0) {
    bVar7 = bVar1 & 0xf0 | bVar7 | 3;
  }
  else {
    if (uVar2 != 0x8000000000000000 || uVar6 != 0x7fff) {
      if ((uVar6 == 0x7fff && uVar2 != 0x8000000000000000) ||
         (((-1 < (long)uVar2 && ((uVar3 & 0x7fff) != 0)) && (uVar6 != 0x7fff)))) {
        this->field_0x12 = (bVar1 & 0xf0 | bVar7) + 1;
        bVar8 = 0xffffff7f < pfVar4->precision - 0x40;
        pSVar5 = (Significand *)(this->significand).parts;
        if (bVar8) {
          pSVar5 = &this->significand;
        }
        pSVar5->part = uVar2;
        pSVar5 = &this->significand;
        if (!bVar8) {
          pSVar5 = (Significand *)(this->significand).part;
        }
        pSVar5[1].part = 0;
        return;
      }
      this->field_0x12 = bVar1 & 0xf0 | bVar7 | 2;
      this->exponent = (short)uVar6 + -0x3fff;
      bVar8 = 0xffffff7f < pfVar4->precision - 0x40;
      pSVar5 = (Significand *)(this->significand).parts;
      if (bVar8) {
        pSVar5 = &this->significand;
      }
      pSVar5->part = uVar2;
      pSVar5 = &this->significand;
      if (!bVar8) {
        pSVar5 = (Significand *)(this->significand).part;
      }
      pSVar5[1].part = 0;
      if ((uVar3 & 0x7fff) != 0) {
        return;
      }
      this->exponent = -0x3ffe;
      return;
    }
    bVar7 = bVar1 & 0xf0 | bVar7;
  }
  this->field_0x12 = bVar7;
  return;
}

Assistant:

void IEEEFloat::initFromF80LongDoubleAPInt(const APInt &api) {
  assert(api.getBitWidth()==80);
  uint64_t i1 = api.getRawData()[0];
  uint64_t i2 = api.getRawData()[1];
  uint64_t myexponent = (i2 & 0x7fff);
  uint64_t mysignificand = i1;
  uint8_t myintegerbit = mysignificand >> 63;

  initialize(&semX87DoubleExtended);
  assert(partCount()==2);

  sign = static_cast<unsigned int>(i2>>15);
  if (myexponent == 0 && mysignificand == 0) {
    // exponent, significand meaningless
    category = fcZero;
  } else if (myexponent==0x7fff && mysignificand==0x8000000000000000ULL) {
    // exponent, significand meaningless
    category = fcInfinity;
  } else if ((myexponent == 0x7fff && mysignificand != 0x8000000000000000ULL) ||
             (myexponent != 0x7fff && myexponent != 0 && myintegerbit == 0)) {
    // exponent meaningless
    category = fcNaN;
    significandParts()[0] = mysignificand;
    significandParts()[1] = 0;
  } else {
    category = fcNormal;
    exponent = myexponent - 16383;
    significandParts()[0] = mysignificand;
    significandParts()[1] = 0;
    if (myexponent==0)          // denormal
      exponent = -16382;
  }
}